

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGenerators::MocDependFilterPush(cmQtAutoGenerators *this,string *key,string *regExp)

{
  bool bVar1;
  ulong uVar2;
  allocator local_211;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_118 [8];
  MocDependFilter filter;
  bool success;
  string *regExp_local;
  string *key_local;
  cmQtAutoGenerators *this_local;
  
  filter.regExp.searchstring._7_1_ = 0;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      MocDependFilter::MocDependFilter((MocDependFilter *)local_118);
      std::__cxx11::string::operator=((string *)local_118,(string *)key);
      bVar1 = cmsys::RegularExpression::compile
                        ((RegularExpression *)((long)&filter.key.field_2 + 8),regExp);
      if (bVar1) {
        std::
        vector<cmQtAutoGenerators::MocDependFilter,_std::allocator<cmQtAutoGenerators::MocDependFilter>_>
        ::push_back(&this->MocDependFilters,(value_type *)local_118);
        filter.regExp.searchstring._7_1_ = 1;
      }
      else {
        Quoted(&local_1a8,key);
        std::operator+(&local_188,
                       "AutoMoc: Error in AUTOMOC_DEPEND_FILTERS: Compiling regular expression failed.\nKey:  "
                       ,&local_1a8);
        std::operator+(&local_168,&local_188,"\nExp.: ");
        Quoted(&local_1c8,regExp);
        std::operator+(&local_148,&local_168,&local_1c8);
        LogError(this,&local_148);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      MocDependFilter::~MocDependFilter((MocDependFilter *)local_118);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1e8,
                 "AutoMoc: Error in AUTOMOC_DEPEND_FILTERS: Regular expression is empty",&local_1e9)
      ;
      LogError(this,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_210,"AutoMoc: Error in AUTOMOC_DEPEND_FILTERS: Key is empty",
               &local_211);
    LogError(this,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
  }
  return (bool)(filter.regExp.searchstring._7_1_ & 1);
}

Assistant:

bool cmQtAutoGenerators::MocDependFilterPush(const std::string& key,
                                             const std::string& regExp)
{
  bool success = false;
  if (!key.empty()) {
    if (!regExp.empty()) {
      MocDependFilter filter;
      filter.key = key;
      if (filter.regExp.compile(regExp)) {
        this->MocDependFilters.push_back(filter);
        success = true;
      } else {
        this->LogError("AutoMoc: Error in AUTOMOC_DEPEND_FILTERS: Compiling "
                       "regular expression failed.\nKey:  " +
                       Quoted(key) + "\nExp.: " + Quoted(regExp));
      }
    } else {
      this->LogError("AutoMoc: Error in AUTOMOC_DEPEND_FILTERS: Regular "
                     "expression is empty");
    }
  } else {
    this->LogError("AutoMoc: Error in AUTOMOC_DEPEND_FILTERS: Key is empty");
  }
  return success;
}